

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O0

int main(void)

{
  initializer_list<double> __l;
  initializer_list<unsigned_long> dims;
  initializer_list<unsigned_long> dims_00;
  bool bVar1;
  reference __in;
  type *input;
  type *label_00;
  Variable<double> *output;
  ostream *poVar2;
  void *pvVar3;
  allocator<double> local_2a9;
  double local_2a8;
  double local_2a0;
  double local_298;
  iterator local_290;
  size_type local_288;
  vector<double,_std::allocator<double>_> local_280;
  Variable<double> *local_268;
  Variable<double> *nn_output_1;
  type *_;
  type *nn_input_1;
  __normal_iterator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_*,_std::vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>_>
  local_248;
  iterator_type __end1;
  iterator_type __begin1;
  DataLoader *__range1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  x_and_ys;
  Variable<double> *loss;
  Variable<double> *nn_output;
  type *label;
  type *nn_input;
  __normal_iterator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_*,_std::vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>_>
  local_1f0;
  iterator_type __end2;
  iterator_type __begin2;
  DataLoader *__range2;
  double iter_loss;
  undefined1 local_1c8 [4];
  int i;
  TensorShape local_1a8;
  TensorShape local_180;
  string_view local_158;
  undefined1 local_148 [8];
  DataLoader dataloader;
  undefined1 local_110 [8];
  TensorShape output_shape;
  undefined1 local_c8 [8];
  TensorShape input_shape;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> local_90;
  undefined1 local_78 [8];
  SGDOptimizer optimizer;
  MyNN mynn;
  
  MyNN::MyNN((MyNN *)&optimizer.learning_rate_);
  yyml::nn::NN::Parameters(&local_90,(NN *)&optimizer.learning_rate_);
  yyml::nn::SGDOptimizer::SGDOptimizer((SGDOptimizer *)local_78,&local_90,0.001);
  std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::~vector
            (&local_90);
  output_shape.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  dims_00._M_len = 2;
  dims_00._M_array =
       (iterator)
       &output_shape.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_c8,dims_00);
  dataloader.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  dims._M_len = 2;
  dims._M_array =
       (iterator)
       &dataloader.data_.
        super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  yyml::TensorShape::TensorShape((TensorShape *)local_110,dims);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_158,"2d_normal_data.txt");
  yyml::TensorShape::TensorShape(&local_180,(TensorShape *)local_c8);
  yyml::TensorShape::TensorShape(&local_1a8,(TensorShape *)local_110);
  yyml::DataLoader::DataLoader((DataLoader *)local_148,local_158,&local_180,&local_1a8);
  yyml::TensorShape::~TensorShape(&local_1a8);
  yyml::TensorShape::~TensorShape(&local_180);
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)local_1c8,yyml::RandomNumberGenerator::NormalDistribution);
  yyml::nn::OptimizerInterface::Apply
            ((OptimizerInterface *)local_78,(function<double_()> *)local_1c8);
  std::function<double_()>::~function((function<double_()> *)local_1c8);
  for (iter_loss._4_4_ = 0; iter_loss._4_4_ < 100; iter_loss._4_4_ = iter_loss._4_4_ + 1) {
    __range2 = (DataLoader *)0x0;
    __end2 = yyml::DataLoader::begin((DataLoader *)local_148);
    local_1f0._M_current =
         (pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_> *)
         yyml::DataLoader::end((DataLoader *)local_148);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&local_1f0);
      if (!bVar1) break;
      __in = __gnu_cxx::
             __normal_iterator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_*,_std::vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>_>
             ::operator*(&__end2);
      input = std::get<0ul,yyml::nn::Variable<double>,yyml::nn::Variable<double>>(__in);
      label_00 = std::get<1ul,yyml::nn::Variable<double>,yyml::nn::Variable<double>>(__in);
      yyml::nn::OptimizerInterface::ZeroGrad((OptimizerInterface *)local_78);
      output = yyml::nn::NN::operator()((NN *)&optimizer.learning_rate_,input);
      x_and_ys.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)LossFunc(output,label_00);
      __range2 = (DataLoader *)
                 ((double)__range2 +
                 *(((Variable<double> *)
                   x_and_ys.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->values_).data_);
      yyml::nn::Variable<double>::Backward
                ((Variable<double> *)
                 x_and_ys.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      yyml::nn::SGDOptimizer::Step((SGDOptimizer *)local_78);
      __gnu_cxx::
      __normal_iterator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_*,_std::vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>_>
      ::operator++(&__end2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"TensorCreated: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,yyml::Tensor<double>::created_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"TensorCopied: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,yyml::Tensor<double>::copied_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"TensorMoved: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,yyml::Tensor<double>::moved_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"TensorDestroyed: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,yyml::Tensor<double>::destroyed_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Loss: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(double)__range2);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&__range1);
  __end1 = yyml::DataLoader::begin((DataLoader *)local_148);
  local_248._M_current =
       (pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_> *)
       yyml::DataLoader::end((DataLoader *)local_148);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_248);
    if (!bVar1) break;
    nn_input_1 = &__gnu_cxx::
                  __normal_iterator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_*,_std::vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>_>
                  ::operator*(&__end1)->first;
    _ = std::get<0ul,yyml::nn::Variable<double>,yyml::nn::Variable<double>>
                  ((pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_> *)nn_input_1);
    nn_output_1 = std::get<1ul,yyml::nn::Variable<double>,yyml::nn::Variable<double>>
                            ((pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_> *)
                             nn_input_1);
    local_268 = yyml::nn::NN::operator()((NN *)&optimizer.learning_rate_,_);
    local_2a8 = *(_->values_).data_;
    local_2a0 = (_->values_).data_[1];
    local_298 = *(local_268->values_).data_;
    local_290 = &local_2a8;
    local_288 = 3;
    std::allocator<double>::allocator(&local_2a9);
    __l._M_len = local_288;
    __l._M_array = local_290;
    std::vector<double,_std::allocator<double>_>::vector(&local_280,__l,&local_2a9);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&__range1,&local_280);
    std::vector<double,_std::allocator<double>_>::~vector(&local_280);
    std::allocator<double>::~allocator(&local_2a9);
    __gnu_cxx::
    __normal_iterator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_*,_std::vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>_>
    ::operator++(&__end1);
  }
  OutputResult((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&__range1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&__range1);
  yyml::DataLoader::~DataLoader((DataLoader *)local_148);
  yyml::TensorShape::~TensorShape((TensorShape *)local_110);
  yyml::TensorShape::~TensorShape((TensorShape *)local_c8);
  yyml::nn::SGDOptimizer::~SGDOptimizer((SGDOptimizer *)local_78);
  MyNN::~MyNN((MyNN *)&optimizer.learning_rate_);
  return 0;
}

Assistant:

int main() {
  MyNN mynn;
  SGDOptimizer optimizer(mynn.Parameters(), 0.001);
  TensorShape input_shape{1, 2}, output_shape{1, 1};
  {
    DataLoader dataloader("2d_normal_data.txt", input_shape, output_shape);
    optimizer.Apply(RandomNumberGenerator::NormalDistribution);

    for (int i = 0; i < 100; i++) {
      double iter_loss = 0;
      for (auto& [nn_input, label] : dataloader) {
        optimizer.ZeroGrad();
        auto* nn_output = mynn(&nn_input);
        auto* loss = LossFunc(nn_output, &label);
        iter_loss += loss->values_.data_[0];
        loss->Backward();
        optimizer.Step();
      }
      std::cout << "TensorCreated: " << Tensor<double>::created_ << std::endl;
      std::cout << "TensorCopied: " << Tensor<double>::copied_ << std::endl;
      std::cout << "TensorMoved: " << Tensor<double>::moved_ << std::endl;
      std::cout << "TensorDestroyed: " << Tensor<double>::destroyed_
                << std::endl;
      std::cout << "Loss: " << iter_loss << std::endl;
    }
    std::vector<std::vector<double>> x_and_ys;
    for (auto& [nn_input, _] : dataloader) {
      auto* nn_output = mynn(&nn_input);
      x_and_ys.emplace_back(std::vector<double>{nn_input.values_.data_[0],
                                                nn_input.values_.data_[1],
                                                nn_output->values_.data_[0]});
    }
    OutputResult(x_and_ys);
  }
}